

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode_msblob2key.c
# Opt level: O0

int msblob2key_export_object
              (void *vctx,void *reference,size_t reference_sz,OSSL_CALLBACK *export_cb,
              void *export_cbarg)

{
  OSSL_FUNC_keymgmt_export_fn *pOVar1;
  OSSL_CALLBACK *in_RCX;
  long in_RDX;
  undefined8 *in_RSI;
  long in_RDI;
  void *in_R8;
  void *keydata;
  OSSL_FUNC_keymgmt_export_fn *export;
  msblob2key_ctx_st *ctx;
  OSSL_DISPATCH *in_stack_ffffffffffffffb8;
  int local_4;
  
  pOVar1 = ossl_prov_get_keymgmt_export(in_stack_ffffffffffffffb8);
  if ((in_RDX == 8) && (pOVar1 != (OSSL_FUNC_keymgmt_export_fn *)0x0)) {
    local_4 = (*pOVar1)((void *)*in_RSI,*(int *)(in_RDI + 0x10),in_RCX,in_R8);
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int
msblob2key_export_object(void *vctx,
                         const void *reference, size_t reference_sz,
                         OSSL_CALLBACK *export_cb, void *export_cbarg)
{
    struct msblob2key_ctx_st *ctx = vctx;
    OSSL_FUNC_keymgmt_export_fn *export =
        ossl_prov_get_keymgmt_export(ctx->desc->fns);
    void *keydata;

    if (reference_sz == sizeof(keydata) && export != NULL) {
        /* The contents of the reference is the address to our object */
        keydata = *(void **)reference;

        return export(keydata, ctx->selection, export_cb, export_cbarg);
    }
    return 0;
}